

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O1

int mbedtls_ssl_config_defaults(mbedtls_ssl_config *conf,int endpoint,int transport,int preset)

{
  uint uVar1;
  int iVar2;
  int *piVar3;
  mbedtls_ecp_group_id *pmVar4;
  uint uVar5;
  uchar dhm_g [1];
  uchar dhm_p [256];
  uchar local_129;
  uchar local_128 [264];
  
  uVar5 = (endpoint & 1U) + (transport & 1U) * 2 | *(uint *)&conf->field_0x174 & 0xfffffffc;
  uVar1 = uVar5 & 0xfffac3b2 | 0x10008;
  if (endpoint != 0) {
    uVar1 = uVar5;
  }
  conf->f_cookie_write = ssl_cookie_write_dummy;
  conf->f_cookie_check = ssl_cookie_check_dummy;
  *(uint *)&conf->field_0x174 = uVar1 | 0x43c40;
  conf->hs_timeout_min = 1000;
  conf->hs_timeout_max = 60000;
  conf->renego_max_records = 0x10;
  conf->renego_period[0] = '\0';
  conf->renego_period[1] = '\0';
  conf->renego_period[2] = 0xff;
  conf->renego_period[3] = 0xff;
  conf->renego_period[4] = 0xff;
  conf->renego_period[5] = 0xff;
  conf->renego_period[6] = 0xff;
  conf->renego_period[7] = 0xff;
  if (endpoint == 1) {
    memcpy(local_128,&DAT_00146300,0x100);
    local_129 = '\x02';
    iVar2 = mbedtls_ssl_conf_dh_param_bin(conf,local_128,0x100,&local_129,1);
    if (iVar2 != 0) {
      return iVar2;
    }
  }
  if (preset == 2) {
    conf->max_major_ver = '\x03';
    conf->max_minor_ver = '\x03';
    conf->min_major_ver = '\x03';
    conf->min_minor_ver = '\x03';
    conf->ciphersuite_list[3] = ssl_preset_suiteb_ciphersuites;
    conf->ciphersuite_list[2] = ssl_preset_suiteb_ciphersuites;
    conf->ciphersuite_list[1] = ssl_preset_suiteb_ciphersuites;
    conf->ciphersuite_list[0] = ssl_preset_suiteb_ciphersuites;
    conf->cert_profile = &mbedtls_x509_crt_profile_suiteb;
    conf->sig_hashes = ssl_preset_suiteb_hashes;
    conf->curve_list = ssl_preset_suiteb_curves;
  }
  else {
    conf->max_major_ver = '\x03';
    conf->max_minor_ver = '\x03';
    conf->min_major_ver = '\x03';
    conf->min_minor_ver = '\x01';
    if (transport == 1) {
      conf->min_minor_ver = '\x02';
    }
    piVar3 = mbedtls_ssl_list_ciphersuites();
    conf->ciphersuite_list[3] = piVar3;
    conf->ciphersuite_list[2] = piVar3;
    conf->ciphersuite_list[1] = piVar3;
    conf->ciphersuite_list[0] = piVar3;
    conf->cert_profile = &mbedtls_x509_crt_profile_default;
    conf->sig_hashes = ssl_preset_default_hashes;
    pmVar4 = mbedtls_ecp_grp_id_list();
    conf->curve_list = pmVar4;
    conf->dhm_min_bitlen = 0x400;
  }
  return 0;
}

Assistant:

int mbedtls_ssl_config_defaults( mbedtls_ssl_config *conf,
                                 int endpoint, int transport, int preset )
{
#if defined(MBEDTLS_DHM_C) && defined(MBEDTLS_SSL_SRV_C)
    int ret;
#endif

    /* Use the functions here so that they are covered in tests,
     * but otherwise access member directly for efficiency */
    mbedtls_ssl_conf_endpoint( conf, endpoint );
    mbedtls_ssl_conf_transport( conf, transport );

    /*
     * Things that are common to all presets
     */
#if defined(MBEDTLS_SSL_CLI_C)
    if( endpoint == MBEDTLS_SSL_IS_CLIENT )
    {
        conf->authmode = MBEDTLS_SSL_VERIFY_REQUIRED;
#if defined(MBEDTLS_SSL_SESSION_TICKETS)
        conf->session_tickets = MBEDTLS_SSL_SESSION_TICKETS_ENABLED;
#endif
    }
#endif

#if defined(MBEDTLS_ARC4_C)
    conf->arc4_disabled = MBEDTLS_SSL_ARC4_DISABLED;
#endif

#if defined(MBEDTLS_SSL_ENCRYPT_THEN_MAC)
    conf->encrypt_then_mac = MBEDTLS_SSL_ETM_ENABLED;
#endif

#if defined(MBEDTLS_SSL_EXTENDED_MASTER_SECRET)
    conf->extended_ms = MBEDTLS_SSL_EXTENDED_MS_ENABLED;
#endif

#if defined(MBEDTLS_SSL_CBC_RECORD_SPLITTING)
    conf->cbc_record_splitting = MBEDTLS_SSL_CBC_RECORD_SPLITTING_ENABLED;
#endif

#if defined(MBEDTLS_SSL_DTLS_HELLO_VERIFY) && defined(MBEDTLS_SSL_SRV_C)
    conf->f_cookie_write = ssl_cookie_write_dummy;
    conf->f_cookie_check = ssl_cookie_check_dummy;
#endif

#if defined(MBEDTLS_SSL_DTLS_ANTI_REPLAY)
    conf->anti_replay = MBEDTLS_SSL_ANTI_REPLAY_ENABLED;
#endif

#if defined(MBEDTLS_SSL_SRV_C)
    conf->cert_req_ca_list = MBEDTLS_SSL_CERT_REQ_CA_LIST_ENABLED;
#endif

#if defined(MBEDTLS_SSL_PROTO_DTLS)
    conf->hs_timeout_min = MBEDTLS_SSL_DTLS_TIMEOUT_DFL_MIN;
    conf->hs_timeout_max = MBEDTLS_SSL_DTLS_TIMEOUT_DFL_MAX;
#endif

#if defined(MBEDTLS_SSL_RENEGOTIATION)
    conf->renego_max_records = MBEDTLS_SSL_RENEGO_MAX_RECORDS_DEFAULT;
    memset( conf->renego_period,     0x00, 2 );
    memset( conf->renego_period + 2, 0xFF, 6 );
#endif

#if defined(MBEDTLS_DHM_C) && defined(MBEDTLS_SSL_SRV_C)
            if( endpoint == MBEDTLS_SSL_IS_SERVER )
            {
                const unsigned char dhm_p[] =
                    MBEDTLS_DHM_RFC3526_MODP_2048_P_BIN;
                const unsigned char dhm_g[] =
                    MBEDTLS_DHM_RFC3526_MODP_2048_G_BIN;

                if ( ( ret = mbedtls_ssl_conf_dh_param_bin( conf,
                                               dhm_p, sizeof( dhm_p ),
                                               dhm_g, sizeof( dhm_g ) ) ) != 0 )
                {
                    return( ret );
                }
            }
#endif

    /*
     * Preset-specific defaults
     */
    switch( preset )
    {
        /*
         * NSA Suite B
         */
        case MBEDTLS_SSL_PRESET_SUITEB:
            conf->min_major_ver = MBEDTLS_SSL_MAJOR_VERSION_3;
            conf->min_minor_ver = MBEDTLS_SSL_MINOR_VERSION_3; /* TLS 1.2 */
            conf->max_major_ver = MBEDTLS_SSL_MAX_MAJOR_VERSION;
            conf->max_minor_ver = MBEDTLS_SSL_MAX_MINOR_VERSION;

            conf->ciphersuite_list[MBEDTLS_SSL_MINOR_VERSION_0] =
            conf->ciphersuite_list[MBEDTLS_SSL_MINOR_VERSION_1] =
            conf->ciphersuite_list[MBEDTLS_SSL_MINOR_VERSION_2] =
            conf->ciphersuite_list[MBEDTLS_SSL_MINOR_VERSION_3] =
                                   ssl_preset_suiteb_ciphersuites;

#if defined(MBEDTLS_X509_CRT_PARSE_C)
            conf->cert_profile = &mbedtls_x509_crt_profile_suiteb;
#endif

#if defined(MBEDTLS_KEY_EXCHANGE__WITH_CERT__ENABLED)
            conf->sig_hashes = ssl_preset_suiteb_hashes;
#endif

#if defined(MBEDTLS_ECP_C)
            conf->curve_list = ssl_preset_suiteb_curves;
#endif
            break;

        /*
         * Default
         */
        default:
            conf->min_major_ver = ( MBEDTLS_SSL_MIN_MAJOR_VERSION >
                                    MBEDTLS_SSL_MIN_VALID_MAJOR_VERSION ) ?
                                    MBEDTLS_SSL_MIN_MAJOR_VERSION :
                                    MBEDTLS_SSL_MIN_VALID_MAJOR_VERSION;
            conf->min_minor_ver = ( MBEDTLS_SSL_MIN_MINOR_VERSION >
                                    MBEDTLS_SSL_MIN_VALID_MINOR_VERSION ) ?
                                    MBEDTLS_SSL_MIN_MINOR_VERSION :
                                    MBEDTLS_SSL_MIN_VALID_MINOR_VERSION;
            conf->max_major_ver = MBEDTLS_SSL_MAX_MAJOR_VERSION;
            conf->max_minor_ver = MBEDTLS_SSL_MAX_MINOR_VERSION;

#if defined(MBEDTLS_SSL_PROTO_DTLS)
            if( transport == MBEDTLS_SSL_TRANSPORT_DATAGRAM )
                conf->min_minor_ver = MBEDTLS_SSL_MINOR_VERSION_2;
#endif

            conf->ciphersuite_list[MBEDTLS_SSL_MINOR_VERSION_0] =
            conf->ciphersuite_list[MBEDTLS_SSL_MINOR_VERSION_1] =
            conf->ciphersuite_list[MBEDTLS_SSL_MINOR_VERSION_2] =
            conf->ciphersuite_list[MBEDTLS_SSL_MINOR_VERSION_3] =
                                   mbedtls_ssl_list_ciphersuites();

#if defined(MBEDTLS_X509_CRT_PARSE_C)
            conf->cert_profile = &mbedtls_x509_crt_profile_default;
#endif

#if defined(MBEDTLS_KEY_EXCHANGE__WITH_CERT__ENABLED)
            conf->sig_hashes = ssl_preset_default_hashes;
#endif

#if defined(MBEDTLS_ECP_C)
            conf->curve_list = mbedtls_ecp_grp_id_list();
#endif

#if defined(MBEDTLS_DHM_C) && defined(MBEDTLS_SSL_CLI_C)
            conf->dhm_min_bitlen = 1024;
#endif
    }

    return( 0 );
}